

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

longlong __thiscall BigInt::operator%(BigInt *this,longlong val)

{
  pair<BigInt,_long_long> local_40;
  longlong local_18;
  longlong val_local;
  BigInt *this_local;
  
  local_18 = val;
  val_local = (longlong)this;
  divModValue(&local_40,this,val);
  std::pair<BigInt,_long_long>::~pair(&local_40);
  return local_40.second;
}

Assistant:

long long operator%(long long val) const { //! divide by val
        return divModValue(val).second;
    }